

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

int POOL_resize(POOL_ctx *ctx,size_t numThreads)

{
  int result;
  size_t numThreads_local;
  POOL_ctx *ctx_local;
  
  if (ctx == (POOL_ctx *)0x0) {
    ctx_local._4_4_ = 1;
  }
  else {
    pthread_mutex_lock((pthread_mutex_t *)&ctx->queueMutex);
    ctx_local._4_4_ = POOL_resize_internal(ctx,numThreads);
    pthread_cond_broadcast((pthread_cond_t *)&ctx->queuePopCond);
    pthread_mutex_unlock((pthread_mutex_t *)&ctx->queueMutex);
  }
  return ctx_local._4_4_;
}

Assistant:

int POOL_resize(POOL_ctx* ctx, size_t numThreads)
{
    int result;
    if (ctx==NULL) return 1;
    ZSTD_pthread_mutex_lock(&ctx->queueMutex);
    result = POOL_resize_internal(ctx, numThreads);
    ZSTD_pthread_cond_broadcast(&ctx->queuePopCond);
    ZSTD_pthread_mutex_unlock(&ctx->queueMutex);
    return result;
}